

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O3

htsFile * hts_open(char *fn,char *mode)

{
  hFILE *hfile;
  htsFile *phVar1;
  
  hfile = hopen(fn,mode);
  if ((hfile != (hFILE *)0x0) && (phVar1 = hts_hopen(hfile,fn,mode), phVar1 != (htsFile *)0x0)) {
    return phVar1;
  }
  if (1 < hts_verbose) {
    fprintf(_stderr,"[E::%s] fail to open file \'%s\'\n","hts_open",fn);
  }
  if (hfile != (hFILE *)0x0) {
    hclose_abruptly(hfile);
  }
  return (htsFile *)0x0;
}

Assistant:

htsFile *hts_open(const char *fn, const char *mode)
{
    htsFile *fp = NULL;
    hFILE *hfile = hopen(fn, mode);
    if (hfile == NULL) goto error;

    fp = hts_hopen(hfile, fn, mode);
    if (fp == NULL) goto error;

    return fp;

error:
    if (hts_verbose >= 2)
        fprintf(stderr, "[E::%s] fail to open file '%s'\n", __func__, fn);

    if (hfile)
        hclose_abruptly(hfile);

    return NULL;
}